

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_protocol_connect(connectdata *conn,_Bool *protocol_done)

{
  _Bool *p_Var1;
  SessionHandle *data;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var2;
  CURLcode CVar3;
  timeval tVar4;
  
  data = conn->data;
  *protocol_done = false;
  if (((conn->bits).tcpconnect[0] == true) && ((conn->bits).protoconnstart == true)) {
    if (conn->handler->connecting != (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      return CURLE_OK;
    }
  }
  else {
    Curl_pgrsTime(data,TIMER_CONNECT);
    Curl_verboseconnect(conn);
    if ((conn->bits).protoconnstart != false) {
      return CURLE_OK;
    }
    tVar4 = curlx_tvnow();
    conn->now = tVar4;
    CVar3 = Curl_proxy_connect(conn);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    p_Var1 = &(conn->bits).protoconnstart;
    p_Var2 = conn->handler->connect_it;
    if (p_Var2 == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      *protocol_done = true;
      protocol_done = p_Var1;
    }
    else {
      CVar3 = (*p_Var2)(conn,protocol_done);
      protocol_done = p_Var1;
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
    }
  }
  *protocol_done = true;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_protocol_connect(struct connectdata *conn,
                               bool *protocol_done)
{
  CURLcode result=CURLE_OK;
  struct SessionHandle *data = conn->data;

  *protocol_done = FALSE;

  if(conn->bits.tcpconnect[FIRSTSOCKET] && conn->bits.protoconnstart) {
    /* We already are connected, get back. This may happen when the connect
       worked fine in the first call, like when we connect to a local server
       or proxy. Note that we don't know if the protocol is actually done.

       Unless this protocol doesn't have any protocol-connect callback, as
       then we know we're done. */
    if(!conn->handler->connecting)
      *protocol_done = TRUE;

    return CURLE_OK;
  }

  Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
  Curl_verboseconnect(conn);

  if(!conn->bits.protoconnstart) {

    /* Set start time here for timeout purposes in the connect procedure, it
       is later set again for the progress meter purpose */
    conn->now = Curl_tvnow();

    result = Curl_proxy_connect(conn);
    if(result)
      return result;

    if(conn->handler->connect_it) {
      /* is there a protocol-specific connect() procedure? */

      /* Call the protocol-specific connect function */
      result = conn->handler->connect_it(conn, protocol_done);
    }
    else
      *protocol_done = TRUE;

    /* it has started, possibly even completed but that knowledge isn't stored
       in this bit! */
    if(!result)
      conn->bits.protoconnstart = TRUE;
  }

  return result; /* pass back status */
}